

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqc.c
# Opt level: O0

void opj_mqc_encode(opj_mqc_t *mqc,OPJ_UINT32 d)

{
  OPJ_UINT32 d_local;
  opj_mqc_t *mqc_local;
  
  if ((*mqc->curctx)->mps == d) {
    opj_mqc_codemps(mqc);
  }
  else {
    opj_mqc_codelps(mqc);
  }
  return;
}

Assistant:

void opj_mqc_encode(opj_mqc_t *mqc, OPJ_UINT32 d)
{
    if ((*mqc->curctx)->mps == d) {
        opj_mqc_codemps(mqc);
    } else {
        opj_mqc_codelps(mqc);
    }
}